

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O2

void __thiscall
cmGlobVerificationManager::AddCacheEntry
          (cmGlobVerificationManager *this,cmGlobCacheEntry *entry,string *variable,
          cmListFileBacktrace *backtrace,cmMessenger *messenger)

{
  uint *puVar1;
  bool l;
  bool s;
  pointer ppVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  pointer ppVar6;
  string local_250;
  string local_230;
  string local_210;
  CacheEntryKey key;
  ostringstream message;
  uint auStack_190 [88];
  
  bVar3 = entry->Recurse;
  l = entry->ListDirectories;
  s = entry->FollowSymlinks;
  std::__cxx11::string::string((string *)&local_230,(string *)&entry->Relative);
  std::__cxx11::string::string((string *)&local_210,(string *)&entry->Expression);
  CacheEntryKey::CacheEntryKey(&key,bVar3,l,s,&local_230,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  pmVar4 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::operator[](&this->Cache,&key);
  if (pmVar4->Initialized == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar4->Files,&entry->Files);
    pmVar4->Initialized = true;
  }
  else {
    bVar3 = std::operator!=(&pmVar4->Files,&entry->Files);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_message + -0x18));
      *puVar1 = *puVar1 | 1;
      std::operator<<((ostream *)&message,"The glob expression\n ");
      CacheEntryKey::PrintGlobCommand(&key,(ostream *)&message,variable);
      std::operator<<((ostream *)&message,
                      "\nwas already present in the glob cache but the directory contents have changed during the configuration run.\n"
                     );
      std::operator<<((ostream *)&message,"Matching glob expressions:");
      ppVar2 = (pmVar4->Backtraces).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar6 = (pmVar4->Backtraces).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1
          ) {
        poVar5 = std::operator<<((ostream *)&message,"\n  ");
        std::operator<<(poVar5,(string *)ppVar6);
        cmMessenger::PrintBacktraceTitle(messenger,(ostream *)&message,&ppVar6->second);
      }
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(messenger,FATAL_ERROR,&local_250,backtrace);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
      goto LAB_0051e18b;
    }
  }
  std::
  vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
  ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
            ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
              *)&pmVar4->Backtraces,variable,backtrace);
LAB_0051e18b:
  CacheEntryKey::~CacheEntryKey(&key);
  return;
}

Assistant:

void cmGlobVerificationManager::AddCacheEntry(
  const cmGlobCacheEntry& entry, const std::string& variable,
  const cmListFileBacktrace& backtrace, cmMessenger* messenger)
{
  CacheEntryKey key =
    CacheEntryKey(entry.Recurse, entry.ListDirectories, entry.FollowSymlinks,
                  entry.Relative, entry.Expression);
  CacheEntryValue& value = this->Cache[key];
  if (!value.Initialized) {
    value.Files = entry.Files;
    value.Initialized = true;
    value.Backtraces.emplace_back(variable, backtrace);
  } else if (value.Initialized && value.Files != entry.Files) {
    std::ostringstream message;
    message << std::boolalpha;
    message << "The glob expression\n ";
    key.PrintGlobCommand(message, variable);
    message << "\nwas already present in the glob cache but the directory "
               "contents have changed during the configuration run.\n";
    message << "Matching glob expressions:";
    for (auto const& bt : value.Backtraces) {
      message << "\n  " << std::get<0>(bt);
      messenger->PrintBacktraceTitle(message, std::get<1>(bt));
    }
    messenger->IssueMessage(MessageType::FATAL_ERROR, message.str(),
                            backtrace);
  } else {
    value.Backtraces.emplace_back(variable, backtrace);
  }
}